

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime_test.cpp
# Opt level: O3

void operations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>,viennamath::rt_variable<viennamath::rt_expression_interface<double>>,viennamath::rt_expr<viennamath::rt_expression_interface<double>>>
               (rt_expr<viennamath::rt_expression_interface<double>_> *e,
               rt_variable<viennamath::rt_expression_interface<double>_> *t,
               rt_expr<viennamath::rt_expression_interface<double>_> *u,double t2,double u2)

{
  rt_expression_interface<double> *prVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  op_interface<viennamath::rt_expression_interface<double>_> *poVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  void *__child_stack;
  void *__child_stack_00;
  void *__child_stack_01;
  void *__child_stack_02;
  void *__child_stack_03;
  void *__child_stack_04;
  void *__child_stack_05;
  void *__child_stack_06;
  rt_variable<viennamath::rt_expression_interface<double>_> *__fn;
  void *in_R8;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> local_68;
  double local_48;
  double local_40;
  double local_38;
  
  __fn = t;
  local_48 = t2;
  local_40 = u2;
  iVar2 = (*(t->super_rt_expression_interface<double>)._vptr_rt_expression_interface[2])(t);
  poVar4 = (op_interface<viennamath::rt_expression_interface<double>_> *)operator_new(8);
  poVar4->_vptr_op_interface = (_func_int **)&PTR__op_interface_0012f520;
  iVar3 = (*((u->rt_expr_)._M_ptr)->_vptr_rt_expression_interface[2])();
  local_68.rhs_._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_00,iVar3);
  local_68.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_0012f0d0;
  local_68.lhs_._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var,iVar2);
  local_68.op_._M_ptr = poVar4;
  iVar2 = viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::clone
                    (&local_68,(__fn *)__fn,__child_stack,0x12f0d0,in_R8);
  prVar1 = (e->rt_expr_)._M_ptr;
  if (prVar1 != (rt_expression_interface<double> *)CONCAT44(extraout_var_01,iVar2)) {
    if (prVar1 != (rt_expression_interface<double> *)0x0) {
      (*prVar1->_vptr_rt_expression_interface[1])();
    }
    (e->rt_expr_)._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_01,iVar2);
  }
  local_68.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_0012f0d0;
  if (local_68.rhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_68.rhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  if (local_68.op_._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
    (*(local_68.op_._M_ptr)->_vptr_op_interface[1])();
  }
  if (local_68.lhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_68.lhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  local_38 = local_48 + local_40;
  evaluations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>>(e,local_38);
  iVar2 = (*((u->rt_expr_)._M_ptr)->_vptr_rt_expression_interface[2])();
  poVar4 = (op_interface<viennamath::rt_expression_interface<double>_> *)operator_new(8);
  poVar4->_vptr_op_interface = (_func_int **)&PTR__op_interface_0012f520;
  iVar3 = (*(t->super_rt_expression_interface<double>)._vptr_rt_expression_interface[2])(t);
  local_68.rhs_._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_03,iVar3);
  local_68.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_0012f0d0;
  local_68.lhs_._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_02,iVar2);
  local_68.op_._M_ptr = poVar4;
  iVar2 = viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::clone
                    (&local_68,(__fn *)__fn,__child_stack_00,0x12f0d0,in_R8);
  prVar1 = (e->rt_expr_)._M_ptr;
  if (prVar1 != (rt_expression_interface<double> *)CONCAT44(extraout_var_04,iVar2)) {
    if (prVar1 != (rt_expression_interface<double> *)0x0) {
      (*prVar1->_vptr_rt_expression_interface[1])();
    }
    (e->rt_expr_)._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_04,iVar2);
  }
  local_68.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_0012f0d0;
  if (local_68.rhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_68.rhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  if (local_68.op_._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
    (*(local_68.op_._M_ptr)->_vptr_op_interface[1])();
  }
  if (local_68.lhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_68.lhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  evaluations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>>(e,local_38);
  iVar2 = (*(t->super_rt_expression_interface<double>)._vptr_rt_expression_interface[2])(t);
  poVar4 = (op_interface<viennamath::rt_expression_interface<double>_> *)operator_new(8);
  poVar4->_vptr_op_interface = (_func_int **)&PTR__op_interface_0012f640;
  iVar3 = (*((u->rt_expr_)._M_ptr)->_vptr_rt_expression_interface[2])();
  local_68.rhs_._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_06,iVar3);
  local_68.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_0012f0d0;
  local_68.lhs_._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_05,iVar2);
  local_68.op_._M_ptr = poVar4;
  iVar2 = viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::clone
                    (&local_68,(__fn *)__fn,__child_stack_01,0x12f0d0,in_R8);
  prVar1 = (e->rt_expr_)._M_ptr;
  if (prVar1 != (rt_expression_interface<double> *)CONCAT44(extraout_var_07,iVar2)) {
    if (prVar1 != (rt_expression_interface<double> *)0x0) {
      (*prVar1->_vptr_rt_expression_interface[1])();
    }
    (e->rt_expr_)._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_07,iVar2);
  }
  local_68.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_0012f0d0;
  if (local_68.rhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_68.rhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  if (local_68.op_._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
    (*(local_68.op_._M_ptr)->_vptr_op_interface[1])();
  }
  if (local_68.lhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_68.lhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  evaluations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>>
            (e,local_48 - local_40);
  iVar2 = (*((u->rt_expr_)._M_ptr)->_vptr_rt_expression_interface[2])();
  poVar4 = (op_interface<viennamath::rt_expression_interface<double>_> *)operator_new(8);
  poVar4->_vptr_op_interface = (_func_int **)&PTR__op_interface_0012f640;
  iVar3 = (*(t->super_rt_expression_interface<double>)._vptr_rt_expression_interface[2])(t);
  local_68.rhs_._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_09,iVar3);
  local_68.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_0012f0d0;
  local_68.lhs_._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_08,iVar2);
  local_68.op_._M_ptr = poVar4;
  iVar2 = viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::clone
                    (&local_68,(__fn *)__fn,__child_stack_02,0x12f0d0,in_R8);
  prVar1 = (e->rt_expr_)._M_ptr;
  if (prVar1 != (rt_expression_interface<double> *)CONCAT44(extraout_var_10,iVar2)) {
    if (prVar1 != (rt_expression_interface<double> *)0x0) {
      (*prVar1->_vptr_rt_expression_interface[1])();
    }
    (e->rt_expr_)._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_10,iVar2);
  }
  local_68.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_0012f0d0;
  if (local_68.rhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_68.rhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  if (local_68.op_._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
    (*(local_68.op_._M_ptr)->_vptr_op_interface[1])();
  }
  if (local_68.lhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_68.lhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  evaluations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>>
            (e,local_40 - local_48);
  iVar2 = (*(t->super_rt_expression_interface<double>)._vptr_rt_expression_interface[2])(t);
  poVar4 = (op_interface<viennamath::rt_expression_interface<double>_> *)operator_new(8);
  poVar4->_vptr_op_interface = (_func_int **)&PTR__op_interface_0012f6d0;
  iVar3 = (*((u->rt_expr_)._M_ptr)->_vptr_rt_expression_interface[2])();
  local_68.rhs_._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_12,iVar3);
  local_68.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_0012f0d0;
  local_68.lhs_._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_11,iVar2);
  local_68.op_._M_ptr = poVar4;
  iVar2 = viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::clone
                    (&local_68,(__fn *)__fn,__child_stack_03,0x12f0d0,in_R8);
  prVar1 = (e->rt_expr_)._M_ptr;
  if (prVar1 != (rt_expression_interface<double> *)CONCAT44(extraout_var_13,iVar2)) {
    if (prVar1 != (rt_expression_interface<double> *)0x0) {
      (*prVar1->_vptr_rt_expression_interface[1])();
    }
    (e->rt_expr_)._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_13,iVar2);
  }
  local_68.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_0012f0d0;
  if (local_68.rhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_68.rhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  if (local_68.op_._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
    (*(local_68.op_._M_ptr)->_vptr_op_interface[1])();
  }
  if (local_68.lhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_68.lhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  local_38 = local_48 * local_40;
  evaluations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>>(e,local_38);
  iVar2 = (*((u->rt_expr_)._M_ptr)->_vptr_rt_expression_interface[2])();
  poVar4 = (op_interface<viennamath::rt_expression_interface<double>_> *)operator_new(8);
  poVar4->_vptr_op_interface = (_func_int **)&PTR__op_interface_0012f6d0;
  iVar3 = (*(t->super_rt_expression_interface<double>)._vptr_rt_expression_interface[2])(t);
  local_68.rhs_._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_15,iVar3);
  local_68.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_0012f0d0;
  local_68.lhs_._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_14,iVar2);
  local_68.op_._M_ptr = poVar4;
  iVar2 = viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::clone
                    (&local_68,(__fn *)__fn,__child_stack_04,0x12f0d0,in_R8);
  prVar1 = (e->rt_expr_)._M_ptr;
  if (prVar1 != (rt_expression_interface<double> *)CONCAT44(extraout_var_16,iVar2)) {
    if (prVar1 != (rt_expression_interface<double> *)0x0) {
      (*prVar1->_vptr_rt_expression_interface[1])();
    }
    (e->rt_expr_)._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_16,iVar2);
  }
  local_68.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_0012f0d0;
  if (local_68.rhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_68.rhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  if (local_68.op_._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
    (*(local_68.op_._M_ptr)->_vptr_op_interface[1])();
  }
  if (local_68.lhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_68.lhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  evaluations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>>(e,local_38);
  iVar2 = (*(t->super_rt_expression_interface<double>)._vptr_rt_expression_interface[2])(t);
  poVar4 = (op_interface<viennamath::rt_expression_interface<double>_> *)operator_new(8);
  poVar4->_vptr_op_interface = (_func_int **)&PTR__op_interface_0012f7d0;
  iVar3 = (*((u->rt_expr_)._M_ptr)->_vptr_rt_expression_interface[2])();
  local_68.rhs_._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_18,iVar3);
  local_68.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_0012f0d0;
  local_68.lhs_._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_17,iVar2);
  local_68.op_._M_ptr = poVar4;
  iVar2 = viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::clone
                    (&local_68,(__fn *)__fn,__child_stack_05,0x12f0d0,in_R8);
  prVar1 = (e->rt_expr_)._M_ptr;
  if (prVar1 != (rt_expression_interface<double> *)CONCAT44(extraout_var_19,iVar2)) {
    if (prVar1 != (rt_expression_interface<double> *)0x0) {
      (*prVar1->_vptr_rt_expression_interface[1])();
    }
    (e->rt_expr_)._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_19,iVar2);
  }
  local_68.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_0012f0d0;
  if (local_68.rhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_68.rhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  if (local_68.op_._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
    (*(local_68.op_._M_ptr)->_vptr_op_interface[1])();
  }
  if (local_68.lhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_68.lhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  evaluations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>>
            (e,local_48 / local_40);
  iVar2 = (*((u->rt_expr_)._M_ptr)->_vptr_rt_expression_interface[2])();
  poVar4 = (op_interface<viennamath::rt_expression_interface<double>_> *)operator_new(8);
  poVar4->_vptr_op_interface = (_func_int **)&PTR__op_interface_0012f7d0;
  iVar3 = (*(t->super_rt_expression_interface<double>)._vptr_rt_expression_interface[2])(t);
  local_68.rhs_._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_21,iVar3);
  local_68.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_0012f0d0;
  local_68.lhs_._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_20,iVar2);
  local_68.op_._M_ptr = poVar4;
  iVar2 = viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::clone
                    (&local_68,(__fn *)__fn,__child_stack_06,0x12f0d0,in_R8);
  prVar1 = (e->rt_expr_)._M_ptr;
  if (prVar1 != (rt_expression_interface<double> *)CONCAT44(extraout_var_22,iVar2)) {
    if (prVar1 != (rt_expression_interface<double> *)0x0) {
      (*prVar1->_vptr_rt_expression_interface[1])();
    }
    (e->rt_expr_)._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var_22,iVar2);
  }
  local_68.super_rt_expression_interface<double>._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_binary_expr_0012f0d0;
  if (local_68.rhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_68.rhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  if (local_68.op_._M_ptr != (op_interface<viennamath::rt_expression_interface<double>_> *)0x0) {
    (*(local_68.op_._M_ptr)->_vptr_op_interface[1])();
  }
  if (local_68.lhs_._M_ptr != (rt_expression_interface<double> *)0x0) {
    (*(local_68.lhs_._M_ptr)->_vptr_rt_expression_interface[1])();
  }
  evaluations_test<viennamath::rt_expr<viennamath::rt_expression_interface<double>>>
            (e,local_40 / local_48);
  return;
}

Assistant:

void operations_test(E & e, T const & t, U const & u, double t2, double u2)
{
  e = t + u; evaluations_test(e, t2 + u2);
  e = u + t; evaluations_test(e, u2 + t2);
  e = t - u; evaluations_test(e, t2 - u2);
  e = u - t; evaluations_test(e, u2 - t2);
  e = t * u; evaluations_test(e, t2 * u2);
  e = u * t; evaluations_test(e, u2 * t2);
  e = t / u; evaluations_test(e, t2 / u2);
  e = u / t; evaluations_test(e, u2 / t2);
}